

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsPSP.cpp
# Opt level: O0

int floatToHalfFloat(int i)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int f;
  int e;
  int s;
  int i_local;
  
  uVar1 = i >> 0x10 & 0x8000;
  iVar2 = (i >> 0x17 & 0xffU) - 0x70;
  uVar3 = i & 0x7fffff;
  if (iVar2 < 1) {
    if (iVar2 < -10) {
      if (uVar1 == 0) {
        s = 0;
      }
      else {
        s = 0x8000;
      }
    }
    else {
      s = uVar1 | ((int)(uVar3 | 0x800000) >> (1U - (char)iVar2 & 0x1f)) >> 0xd;
    }
  }
  else if (iVar2 == 0x8f) {
    if (uVar3 == 0) {
      s = uVar1 | 0x7c00;
    }
    else {
      s = uVar1 | 0x7fff;
    }
  }
  else if (iVar2 < 0x1f) {
    s = uVar1 | iVar2 * 0x400 | (int)uVar3 >> 0xd;
  }
  else {
    s = uVar1 | 0x7c00;
  }
  return s;
}

Assistant:

int floatToHalfFloat(int i)
{
	int s = ((i >> 16) & 0x00008000); // sign
	int e = ((i >> 23) & 0x000000ff) - (127 - 15); // exponent
	int f = ((i >> 0) & 0x007fffff); // fraction

	// need to handle NaNs and Inf?
	if (e <= 0) {
		if (e < -10) {
			if (s != 0) {
				// handle -0.0
				return 0x8000;
			}
			return 0;
		}
		f = (f | 0x00800000) >> (1 - e);
		return s | (f >> 13);
	} else if (e == 0xff - (127 - 15)) {
		if (f == 0) {
			// Inf
			return s | 0x7c00;
		}
		// NAN
		f >>= 13;
		f = 0x3ff; // PSP always encodes NaN with this value
		return s | 0x7c00 | f | ((f == 0) ? 1 : 0);
	}

	if (e > 30) {
		// Overflow
		return s | 0x7c00;
	}

	return s | (e << 10) | (f >> 13);
}